

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O0

Ref __thiscall gnilk::LogManager::GetOrAddLog(LogManager *this,string *name)

{
  lock_guard<std::mutex> name_00;
  bool bVar1;
  __shared_ptr_access<gnilk::LogInstance,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  mapped_type *this_02;
  mutex_type *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ref RVar2;
  undefined1 local_90 [32];
  undefined1 local_70 [8];
  Ref instance;
  Ref writer;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>,_true>
  local_30;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> lock;
  string *name_local;
  LogManager *this_local;
  
  lock._M_device = in_RDX;
  std::lock_guard<std::mutex>::lock_guard(&local_28,(mutex_type *)(name + 2));
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>_>_>
       ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>_>_>
               *)&name[4].field_2,(key_type *)lock._M_device);
  local_48._M_allocated_capacity =
       (size_type)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>_>_>
              *)&name[4].field_2);
  bVar1 = std::__detail::operator==
                    (&local_30,
                     (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>,_true>
                      *)&local_48._M_allocated_capacity);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    Log::Create((Log *)&instance.super___shared_ptr<gnilk::LogInstance,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,(string *)lock._M_device);
    name_00 = lock;
    std::shared_ptr<gnilk::Log>::shared_ptr
              ((shared_ptr<gnilk::Log> *)(local_90 + 0x10),
               (shared_ptr<gnilk::Log> *)
               &instance.super___shared_ptr<gnilk::LogInstance,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    LogInstance::Create((LogInstance *)local_70,(string *)name_00._M_device,
                        (shared_ptr<gnilk::Log> *)(local_90 + 0x10));
    std::shared_ptr<gnilk::Log>::~shared_ptr((shared_ptr<gnilk::Log> *)(local_90 + 0x10));
    std::__shared_ptr_access<gnilk::LogInstance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gnilk::LogInstance,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               local_70);
    LogInstance::GetLog((LogInstance *)local_90);
    this_01 = std::__shared_ptr_access<gnilk::Log,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<gnilk::Log,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_90);
    Log::SetEnabled(this_01,(bool)(*(byte *)((long)&name->_M_string_length + 1) & 1));
    std::shared_ptr<gnilk::Log>::~shared_ptr((shared_ptr<gnilk::Log> *)local_90);
    this_02 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>_>_>
              ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>_>_>
                            *)&name[4].field_2,(key_type *)lock._M_device);
    std::shared_ptr<gnilk::LogInstance>::operator=
              (this_02,(shared_ptr<gnilk::LogInstance> *)local_70);
    std::__shared_ptr_access<gnilk::LogInstance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gnilk::LogInstance,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               local_70);
    LogInstance::GetLog((LogInstance *)this);
    std::shared_ptr<gnilk::LogInstance>::~shared_ptr((shared_ptr<gnilk::LogInstance> *)local_70);
    std::shared_ptr<gnilk::Log>::~shared_ptr
              ((shared_ptr<gnilk::Log> *)
               &instance.super___shared_ptr<gnilk::LogInstance,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  else {
    this_00 = (__shared_ptr_access<gnilk::LogInstance,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>_>_>
              ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>_>_>
                            *)&name[4].field_2,(key_type *)lock._M_device);
    std::__shared_ptr_access<gnilk::LogInstance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->(this_00);
    LogInstance::GetLog((LogInstance *)this);
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  RVar2.super___shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  RVar2.super___shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Ref)RVar2.super___shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Log::Ref LogManager::GetOrAddLog(const std::string &name) {
    std::lock_guard<std::mutex> lock(instLock);

    if (logInstances.find(name) != logInstances.end()) {
        return logInstances[name]->GetLog();
    }
    // Create the writer and the instance...
    auto writer = Log::Create(name);
    auto instance = LogInstance::Create(name, writer);

    instance->GetLog()->SetEnabled(enableLogOnCreate);

    logInstances[name] = instance;
    return instance->GetLog();
}